

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O1

void unpackforblock17(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pout;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  uVar7 = puVar1[4];
  uVar8 = puVar1[5];
  uVar9 = puVar1[6];
  uVar10 = puVar1[7];
  uVar11 = puVar1[8];
  *pw = (uint8_t *)((long)puVar1 + 0x44);
  *puVar2 = ((uint)uVar3 & 0x1ffff) + base;
  puVar2[1] = ((uint)(uVar3 >> 0x11) & 0x1ffff) + base;
  uVar12 = (uint)(uVar3 >> 0x20);
  puVar2[2] = (uVar12 >> 2 & 0x1ffff) + base;
  puVar2[3] = ((uint)(uVar4 << 0xd) & 0x1ffff | uVar12 >> 0x13) + base;
  puVar2[4] = ((uint)(uVar4 >> 4) & 0x1ffff) + base;
  puVar2[5] = ((uint)(uVar4 >> 0x15) & 0x1ffff) + base;
  uVar12 = (uint)(uVar4 >> 0x20);
  puVar2[6] = (uVar12 >> 6 & 0x1ffff) + base;
  puVar2[7] = ((uint)(uVar5 << 9) & 0x1ffff | uVar12 >> 0x17) + base;
  puVar2[8] = ((uint)(uVar5 >> 8) & 0x1ffff) + base;
  puVar2[9] = ((uint)(uVar5 >> 0x19) & 0x1ffff) + base;
  uVar12 = (uint)(uVar5 >> 0x20);
  puVar2[10] = (uVar12 >> 10 & 0x1ffff) + base;
  puVar2[0xb] = ((uint)(uVar6 << 5) & 0x1ffff | uVar12 >> 0x1b) + base;
  puVar2[0xc] = ((uint)(uVar6 >> 0xc) & 0x1ffff) + base;
  puVar2[0xd] = ((uint)(uVar6 >> 0x1d) & 0x1ffff) + base;
  uVar12 = (uint)(uVar6 >> 0x20);
  puVar2[0xe] = (uVar12 >> 0xe & 0x1ffff) + base;
  puVar2[0xf] = ((uint)(uVar7 << 1) & 0x1ffff | uVar12 >> 0x1f) + base;
  puVar2[0x10] = ((uint)(uVar7 >> 0x10) & 0x1ffff) + base;
  uVar12 = (uint)(uVar7 >> 0x20);
  puVar2[0x11] = (uVar12 >> 1 & 0x1ffff) + base;
  puVar2[0x12] = ((uint)(uVar8 << 0xe) & 0x1ffff | uVar12 >> 0x12) + base;
  puVar2[0x13] = ((uint)(uVar8 >> 3) & 0x1ffff) + base;
  puVar2[0x14] = ((uint)(uVar8 >> 0x14) & 0x1ffff) + base;
  uVar12 = (uint)(uVar8 >> 0x20);
  puVar2[0x15] = (uVar12 >> 5 & 0x1ffff) + base;
  puVar2[0x16] = ((uint)(uVar9 << 10) & 0x1ffff | uVar12 >> 0x16) + base;
  puVar2[0x17] = ((uint)(uVar9 >> 7) & 0x1ffff) + base;
  puVar2[0x18] = ((uint)(uVar9 >> 0x18) & 0x1ffff) + base;
  uVar12 = (uint)(uVar9 >> 0x20);
  puVar2[0x19] = (uVar12 >> 9 & 0x1ffff) + base;
  puVar2[0x1a] = ((uint)(uVar10 << 6) & 0x1ffff | uVar12 >> 0x1a) + base;
  puVar2[0x1b] = ((uint)(uVar10 >> 0xb) & 0x1ffff) + base;
  puVar2[0x1c] = ((uint)(uVar10 >> 0x1c) & 0x1ffff) + base;
  uVar12 = (uint)(uVar10 >> 0x20);
  puVar2[0x1d] = (uVar12 >> 0xd & 0x1ffff) + base;
  puVar2[0x1e] = ((uint)(uVar11 << 2) & 0x1ffff | uVar12 >> 0x1e) + base;
  puVar2[0x1f] = ((uint)(uVar11 >> 0xf) & 0x1ffff) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock17(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(131071);
  /* we are going to access  9 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  *pw += 68; /* we used up 68 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 17) & mask);
  out[2] = base + (uint32_t)((w0 >> 34) & mask);
  out[3] = base + (uint32_t)(((w0 >> 51) | (w1 << 13)) & mask);
  out[4] = base + (uint32_t)((w1 >> 4) & mask);
  out[5] = base + (uint32_t)((w1 >> 21) & mask);
  out[6] = base + (uint32_t)((w1 >> 38) & mask);
  out[7] = base + (uint32_t)(((w1 >> 55) | (w2 << 9)) & mask);
  out[8] = base + (uint32_t)((w2 >> 8) & mask);
  out[9] = base + (uint32_t)((w2 >> 25) & mask);
  out[10] = base + (uint32_t)((w2 >> 42) & mask);
  out[11] = base + (uint32_t)(((w2 >> 59) | (w3 << 5)) & mask);
  out[12] = base + (uint32_t)((w3 >> 12) & mask);
  out[13] = base + (uint32_t)((w3 >> 29) & mask);
  out[14] = base + (uint32_t)((w3 >> 46) & mask);
  out[15] = base + (uint32_t)(((w3 >> 63) | (w4 << 1)) & mask);
  out[16] = base + (uint32_t)((w4 >> 16) & mask);
  out[17] = base + (uint32_t)((w4 >> 33) & mask);
  out[18] = base + (uint32_t)(((w4 >> 50) | (w5 << 14)) & mask);
  out[19] = base + (uint32_t)((w5 >> 3) & mask);
  out[20] = base + (uint32_t)((w5 >> 20) & mask);
  out[21] = base + (uint32_t)((w5 >> 37) & mask);
  out[22] = base + (uint32_t)(((w5 >> 54) | (w6 << 10)) & mask);
  out[23] = base + (uint32_t)((w6 >> 7) & mask);
  out[24] = base + (uint32_t)((w6 >> 24) & mask);
  out[25] = base + (uint32_t)((w6 >> 41) & mask);
  out[26] = base + (uint32_t)(((w6 >> 58) | (w7 << 6)) & mask);
  out[27] = base + (uint32_t)((w7 >> 11) & mask);
  out[28] = base + (uint32_t)((w7 >> 28) & mask);
  out[29] = base + (uint32_t)((w7 >> 45) & mask);
  out[30] = base + (uint32_t)(((w7 >> 62) | (w8 << 2)) & mask);
  out[31] = base + (uint32_t)((w8 >> 15) & mask);
  *pout += 32; /* we wrote 32 32-bit integers */
}